

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

simdjson_result<simdjson::dom::element> * __thiscall
simdjson::dom::parser::parse_into_document
          (simdjson_result<simdjson::dom::element> *__return_storage_ptr__,parser *this,
          document *provided_doc,uint8_t *buf,size_t len,bool realloc_if_needed)

{
  bool bVar1;
  char *__p;
  pointer __dest;
  pointer pdVar2;
  pointer local_1b0;
  tape_ref local_180;
  error_code local_170;
  byte local_169;
  error_code _error;
  bool realloc_if_needed_local;
  size_t len_local;
  uint8_t *buf_local;
  document *provided_doc_local;
  parser *this_local;
  simdjson_result<simdjson::dom::element> *local_140;
  undefined4 local_134;
  simdjson_result<simdjson::dom::element> *local_130;
  error_code local_124;
  simdjson_result<simdjson::dom::element> *local_120;
  tape_ref *local_118;
  simdjson_result<simdjson::dom::element> *local_110;
  element local_108;
  error_code local_f4;
  simdjson_result<simdjson::dom::element> *local_f0;
  element local_e8;
  undefined4 local_d4;
  simdjson_result<simdjson::dom::element> *local_d0;
  element local_c8;
  error_code local_b4;
  simdjson_result<simdjson::dom::element> *local_b0;
  element *local_a8;
  element *local_a0;
  element *local_98;
  error_code local_8c;
  element *local_88;
  simdjson_result<simdjson::dom::element> *local_80;
  error_code local_74;
  element *local_70;
  simdjson_result<simdjson::dom::element> *local_68;
  error_code local_5c;
  element *local_58;
  simdjson_result<simdjson::dom::element> *local_50;
  element *local_48;
  element *local_40;
  element *local_38;
  tape_ref *local_30;
  simdjson_result<simdjson::dom::element> *local_28;
  error_code local_1c;
  tape_ref *local_18;
  simdjson_result<simdjson::dom::element> *local_10;
  
  local_169 = realloc_if_needed;
  __error = len;
  len_local = (size_t)buf;
  buf_local = (uint8_t *)provided_doc;
  provided_doc_local = (document *)this;
  local_170 = ensure_capacity(this,provided_doc,len);
  if (local_170 == SUCCESS) {
    if ((local_169 & 1) != 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->loaded_bytes);
      if ((!bVar1) || (this->_loaded_bytes_capacity < __error)) {
        __p = internal::allocate_padded_buffer(__error);
        std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                  ((unique_ptr<char[],std::default_delete<char[]>> *)&this->loaded_bytes,__p);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->loaded_bytes);
        if (!bVar1) {
          local_134 = 2;
          local_d4 = 2;
          local_a0 = &local_e8;
          local_e8.tape.doc = (document *)0x0;
          local_e8.tape.json_index = 0;
          local_74 = MEMALLOC;
          local_130 = __return_storage_ptr__;
          local_d0 = __return_storage_ptr__;
          local_70 = local_a0;
          local_68 = __return_storage_ptr__;
          local_40 = local_a0;
          std::pair<simdjson::dom::element,_simdjson::error_code>::
          pair<simdjson::dom::element,_simdjson::error_code_&,_true>
                    ((pair<simdjson::dom::element,_simdjson::error_code> *)__return_storage_ptr__,
                     local_a0,&local_74);
          return __return_storage_ptr__;
        }
        this->_loaded_bytes_capacity = __error;
      }
      __dest = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->loaded_bytes);
      memcpy(__dest,(void *)len_local,__error);
    }
    pdVar2 = std::
             unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
             ::operator->(&this->implementation);
    if ((local_169 & 1) == 0) {
      local_1b0 = (pointer)len_local;
    }
    else {
      local_1b0 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->loaded_bytes);
    }
    local_170 = (**pdVar2->_vptr_dom_parser_implementation)(pdVar2,local_1b0,__error,buf_local);
    if (local_170 == SUCCESS) {
      local_180 = (tape_ref)document::root((document *)buf_local);
      local_118 = &local_180;
      local_1c = SUCCESS;
      local_110 = __return_storage_ptr__;
      local_30 = local_118;
      local_28 = __return_storage_ptr__;
      local_18 = local_118;
      local_10 = __return_storage_ptr__;
      std::pair<simdjson::dom::element,_simdjson::error_code>::
      pair<simdjson::dom::element,_simdjson::error_code_&,_true>
                ((pair<simdjson::dom::element,_simdjson::error_code> *)__return_storage_ptr__,
                 (element *)local_118,&local_1c);
    }
    else {
      local_98 = &local_108;
      local_108.tape.doc = (document *)0x0;
      local_108.tape.json_index = 0;
      local_124 = local_170;
      local_120 = __return_storage_ptr__;
      local_f4 = local_170;
      local_f0 = __return_storage_ptr__;
      local_5c = local_170;
      local_58 = local_98;
      local_50 = __return_storage_ptr__;
      local_48 = local_98;
      std::pair<simdjson::dom::element,_simdjson::error_code>::
      pair<simdjson::dom::element,_simdjson::error_code_&,_true>
                ((pair<simdjson::dom::element,_simdjson::error_code> *)__return_storage_ptr__,
                 local_98,&local_5c);
    }
  }
  else {
    local_a8 = &local_c8;
    local_c8.tape.doc = (document *)0x0;
    local_c8.tape.json_index = 0;
    this_local._4_4_ = local_170;
    local_140 = __return_storage_ptr__;
    local_b4 = local_170;
    local_b0 = __return_storage_ptr__;
    local_8c = local_170;
    local_88 = local_a8;
    local_80 = __return_storage_ptr__;
    local_38 = local_a8;
    std::pair<simdjson::dom::element,_simdjson::error_code>::
    pair<simdjson::dom::element,_simdjson::error_code_&,_true>
              ((pair<simdjson::dom::element,_simdjson::error_code> *)__return_storage_ptr__,local_a8
               ,&local_8c);
  }
  return __return_storage_ptr__;
}

Assistant:

inline simdjson_result<element> parser::parse_into_document(document& provided_doc, const uint8_t *buf, size_t len, bool realloc_if_needed) & noexcept {
  // Important: we need to ensure that document has enough capacity.
  // Important: It is possible that provided_doc is actually the internal 'doc' within the parser!!!
  error_code _error = ensure_capacity(provided_doc, len);
  if (_error) { return _error; }
  if (realloc_if_needed) {
    // Make sure we have enough capacity to copy len bytes
    if (!loaded_bytes || _loaded_bytes_capacity < len) {
      loaded_bytes.reset( internal::allocate_padded_buffer(len) );
      if (!loaded_bytes) {
        return MEMALLOC;
      }
      _loaded_bytes_capacity = len;
    }
    std::memcpy(static_cast<void *>(loaded_bytes.get()), buf, len);
  }
  _error = implementation->parse(realloc_if_needed ? reinterpret_cast<const uint8_t*>(loaded_bytes.get()): buf, len, provided_doc);

  if (_error) { return _error; }

  return provided_doc.root();
}